

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBlobSearch(void *pBlob,sxu32 nLen,void *pPattern,sxu32 pLen,sxu32 *pOfft)

{
  int iVar1;
  sxu32 sVar2;
  uchar *puVar3;
  uchar *puVar4;
  byte *pbVar5;
  byte *pbVar6;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  sxu32 local_ac;
  byte *pbStack_a8;
  sxu32 LEN_3;
  uchar *r2_3;
  uchar *r1_3;
  byte *pbStack_90;
  sxu32 LEN_2;
  uchar *r2_2;
  uchar *r1_2;
  byte *pbStack_78;
  sxu32 LEN_1;
  uchar *r2_1;
  uchar *r1_1;
  byte *pbStack_60;
  sxu32 LEN;
  uchar *r2;
  uchar *r1;
  sxi32 rc;
  char *zEnd;
  char *zIn;
  sxu32 *pOfft_local;
  sxu32 pLen_local;
  void *pPattern_local;
  sxu32 nLen_local;
  void *pBlob_local;
  
  if (pLen <= nLen) {
    puVar3 = (uchar *)((long)pBlob + (ulong)(nLen - pLen));
    for (zEnd = (char *)pBlob; zEnd <= puVar3; zEnd = zEnd + 4) {
      r1_1._4_4_ = pLen;
      pbStack_60 = (byte *)pPattern;
      for (r2 = (uchar *)zEnd;
          (sVar2 = r1_1._4_4_, pbVar6 = pbStack_60, pbVar5 = r2, r1_1._4_4_ != 0 &&
          (*r2 == *pbStack_60)); r2 = r2 + 4) {
        pbVar5 = r2 + 1;
        pbVar6 = pbStack_60 + 1;
        sVar2 = r1_1._4_4_ - 1;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbVar5 = r2 + 2;
        pbVar6 = pbStack_60 + 2;
        sVar2 = r1_1._4_4_ - 2;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbVar5 = r2 + 3;
        pbVar6 = pbStack_60 + 3;
        sVar2 = r1_1._4_4_ - 3;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbStack_60 = pbStack_60 + 4;
        r1_1._4_4_ = r1_1._4_4_ - 4;
      }
      r2 = pbVar5;
      pbStack_60 = pbVar6;
      r1_1._4_4_ = sVar2;
      if (r1_1._4_4_ == 0) {
        local_b0 = 0;
      }
      else {
        local_b0 = (uint)*r2 - (uint)*pbStack_60;
      }
      iVar1 = (int)pBlob;
      if (local_b0 == 0) {
        if (pOfft != (sxu32 *)0x0) {
          *pOfft = (int)zEnd - iVar1;
        }
        return 0;
      }
      puVar4 = (uchar *)(zEnd + 1);
      r1_2._4_4_ = pLen;
      pbStack_78 = (byte *)pPattern;
      r2_1 = puVar4;
      if (puVar3 < puVar4) {
        return -6;
      }
      for (; (sVar2 = r1_2._4_4_, pbVar6 = pbStack_78, pbVar5 = r2_1, r1_2._4_4_ != 0 &&
             (*r2_1 == *pbStack_78)); r2_1 = r2_1 + 4) {
        pbVar5 = r2_1 + 1;
        pbVar6 = pbStack_78 + 1;
        sVar2 = r1_2._4_4_ - 1;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbVar5 = r2_1 + 2;
        pbVar6 = pbStack_78 + 2;
        sVar2 = r1_2._4_4_ - 2;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbVar5 = r2_1 + 3;
        pbVar6 = pbStack_78 + 3;
        sVar2 = r1_2._4_4_ - 3;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbStack_78 = pbStack_78 + 4;
        r1_2._4_4_ = r1_2._4_4_ - 4;
      }
      r2_1 = pbVar5;
      pbStack_78 = pbVar6;
      r1_2._4_4_ = sVar2;
      if (r1_2._4_4_ == 0) {
        local_b4 = 0;
      }
      else {
        local_b4 = (uint)*r2_1 - (uint)*pbStack_78;
      }
      if (local_b4 == 0) {
        if (pOfft != (sxu32 *)0x0) {
          *pOfft = (int)puVar4 - iVar1;
        }
        return 0;
      }
      puVar4 = (uchar *)(zEnd + 2);
      r1_3._4_4_ = pLen;
      pbStack_90 = (byte *)pPattern;
      r2_2 = puVar4;
      if (puVar3 < puVar4) {
        return -6;
      }
      for (; (sVar2 = r1_3._4_4_, pbVar6 = pbStack_90, pbVar5 = r2_2, r1_3._4_4_ != 0 &&
             (*r2_2 == *pbStack_90)); r2_2 = r2_2 + 4) {
        pbVar5 = r2_2 + 1;
        pbVar6 = pbStack_90 + 1;
        sVar2 = r1_3._4_4_ - 1;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbVar5 = r2_2 + 2;
        pbVar6 = pbStack_90 + 2;
        sVar2 = r1_3._4_4_ - 2;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbVar5 = r2_2 + 3;
        pbVar6 = pbStack_90 + 3;
        sVar2 = r1_3._4_4_ - 3;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbStack_90 = pbStack_90 + 4;
        r1_3._4_4_ = r1_3._4_4_ - 4;
      }
      r2_2 = pbVar5;
      pbStack_90 = pbVar6;
      r1_3._4_4_ = sVar2;
      if (r1_3._4_4_ == 0) {
        local_b8 = 0;
      }
      else {
        local_b8 = (uint)*r2_2 - (uint)*pbStack_90;
      }
      if (local_b8 == 0) {
        if (pOfft != (sxu32 *)0x0) {
          *pOfft = (int)puVar4 - iVar1;
        }
        return 0;
      }
      puVar4 = (uchar *)(zEnd + 3);
      local_ac = pLen;
      pbStack_a8 = (byte *)pPattern;
      r2_3 = puVar4;
      if (puVar3 < puVar4) {
        return -6;
      }
      for (; (sVar2 = local_ac, pbVar6 = pbStack_a8, pbVar5 = r2_3, local_ac != 0 &&
             (*r2_3 == *pbStack_a8)); r2_3 = r2_3 + 4) {
        pbVar5 = r2_3 + 1;
        pbVar6 = pbStack_a8 + 1;
        sVar2 = local_ac - 1;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbVar5 = r2_3 + 2;
        pbVar6 = pbStack_a8 + 2;
        sVar2 = local_ac - 2;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbVar5 = r2_3 + 3;
        pbVar6 = pbStack_a8 + 3;
        sVar2 = local_ac - 3;
        if ((sVar2 == 0) || (*pbVar5 != *pbVar6)) break;
        pbStack_a8 = pbStack_a8 + 4;
        local_ac = local_ac - 4;
      }
      r2_3 = pbVar5;
      pbStack_a8 = pbVar6;
      local_ac = sVar2;
      if (local_ac == 0) {
        local_bc = 0;
      }
      else {
        local_bc = (uint)*r2_3 - (uint)*pbStack_a8;
      }
      if (local_bc == 0) {
        if (pOfft != (sxu32 *)0x0) {
          *pOfft = (int)puVar4 - iVar1;
        }
        return 0;
      }
    }
  }
  return -6;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobSearch(const void *pBlob, sxu32 nLen, const void *pPattern, sxu32 pLen, sxu32 *pOfft)
{
	const char *zIn = (const char *)pBlob;
	const char *zEnd;
	sxi32 rc;
	if( pLen > nLen ){
		return SXERR_NOTFOUND;
	}
	zEnd = &zIn[nLen-pLen];
	for(;;){
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
	}
	return SXERR_NOTFOUND;
}